

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExprNode * __thiscall Parser::atom(Parser *this,Token *tok)

{
  ExprNode *this_00;
  undefined8 extraout_RAX;
  Token *this_01;
  Token closeParen;
  allocator<char> local_25a;
  allocator<char> local_259;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  Token local_1d8;
  Token local_168;
  Token local_f8;
  Token local_88;
  
  if (tok->_isWholeNumber == true) {
    this_00 = (ExprNode *)operator_new(0x80);
    Token::Token(&local_88,tok);
    WholeNumber::WholeNumber((WholeNumber *)this_00,&local_88);
    this_01 = &local_88;
  }
  else if ((tok->_name)._M_string_length == 0) {
    if (tok->_symbol == '(') {
      this_00 = exprOrTest(this);
      tok = &local_1d8;
      Tokenizer::getToken(tok,this->tokenizer);
      if (local_1d8._symbol != ')') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"Parser::primary",&local_25a);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"Expected close-parenthesis, instead got",&local_259);
        die(this,&local_1f8,&local_218,&local_1d8);
LAB_00108717:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"Parser::primary",(allocator<char> *)&local_1d8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"Unexpected token",&local_25a);
        die(this,&local_238,&local_258,tok);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_238);
        _Unwind_Resume(extraout_RAX);
      }
      this_01 = &local_1d8;
    }
    else {
      if (tok->_isString != true) goto LAB_00108717;
      this_00 = (ExprNode *)operator_new(0x80);
      Token::Token(&local_168,tok);
      String::String((String *)this_00,&local_168);
      this_01 = &local_168;
    }
  }
  else {
    Tokenizer::ungetToken(this->tokenizer);
    this_00 = (ExprNode *)operator_new(0x80);
    Token::Token(&local_f8,tok);
    Variable::Variable((Variable *)this_00,&local_f8);
    this_01 = &local_f8;
  }
  Token::~Token(this_01);
  return this_00;
}

Assistant:

ExprNode *Parser::atom(Token tok) {
    // atom: ID | NUMBER | STRING+ | ( test )
    // This function parses the grammar rules:

    // <primary> -> [0-9]+
    // <primary> -> [_a-zA-Z][_a-zA-Z0-9]*
    // <primary> -> (<expr>)

    //Token tok = tokenizer.getToken();
    if (tok.isWholeNumber() )
        return new WholeNumber(tok);
    else if( tok.isName() ) {
        tokenizer.ungetToken();
        //ExprNode * id = variableID();
        return new Variable(tok);;
    }
    else if (tok.isOpenParen()) {
        ExprNode *p = test();
        Token closeParen = tokenizer.getToken();
        if (!closeParen.isCloseParen())
            die("Parser::primary", "Expected close-parenthesis, instead got", closeParen);
        return p;
    } else if(tok.isString())
        return new String(tok);

    die("Parser::primary", "Unexpected token", tok);
    return nullptr;  // Will not reach this statement!
}